

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O0

int ipc_listener_listen(void *arg)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  sockaddr_un *su;
  char *local_b8;
  char *path;
  int fd;
  int rv;
  sockaddr_storage ss;
  socklen_t len;
  ipc_listener *l;
  void *arg_local;
  
  sVar3 = nni_posix_nn2sockaddr(&fd,(nni_sockaddr *)((long)arg + 0x88));
  ss.__ss_align._4_4_ = (uint)sVar3;
  if ((sVar3 & 0xffffffff) < 2) {
    arg_local._4_4_ = 0xf;
  }
  else {
    nni_mtx_lock((nni_mtx *)((long)arg + 0x140));
    if ((*(byte *)((long)arg + 0x128) & 1) == 0) {
      if ((*(byte *)((long)arg + 0x129) & 1) == 0) {
        if (*(short *)((long)arg + 0x88) == 2) {
          local_b8 = nni_strdup((char *)((long)arg + 0x8a));
          if (local_b8 == (char *)0x0) {
            nni_mtx_unlock((nni_mtx *)((long)arg + 0x140));
            return 2;
          }
        }
        else {
          if (*(short *)((long)arg + 0x88) != 5) {
            nni_mtx_unlock((nni_mtx *)((long)arg + 0x140));
            return 0xf;
          }
          local_b8 = (char *)0x0;
        }
        iVar1 = socket(1,0x80001,0);
        if (iVar1 < 0) {
          piVar4 = __errno_location();
          arg_local._4_4_ = nni_plat_errno(*piVar4);
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x140));
          nni_strfree(local_b8);
        }
        else {
          path._4_4_ = bind(iVar1,(sockaddr *)&fd,ss.__ss_align._4_4_);
          if (path._4_4_ != 0) {
            if ((*(short *)((long)arg + 0x88) == 2) &&
               ((piVar4 = __errno_location(), *piVar4 == 0x11 ||
                (piVar4 = __errno_location(), *piVar4 == 0x62)))) {
              ipc_remove_stale(local_b8);
              path._4_4_ = bind(iVar1,(sockaddr *)&fd,ss.__ss_align._4_4_);
            }
            if (path._4_4_ != 0) {
              nni_strfree(local_b8);
              local_b8 = (char *)0x0;
            }
          }
          if (((path._4_4_ != 0) ||
              (iVar2 = ipc_listener_chmod((ipc_listener *)arg,local_b8), iVar2 != 0)) ||
             (iVar2 = listen(iVar1,0x80), iVar2 != 0)) {
            piVar4 = __errno_location();
            path._4_4_ = nni_plat_errno(*piVar4);
          }
          if (path._4_4_ == 0) {
            nni_posix_pfd_init((nni_posix_pfd *)((long)arg + 0x50),iVar1,ipc_listener_cb,arg);
            if ((*(short *)((long)arg + 0x88) == 5) && (*(short *)((long)arg + 0x8a) == 0)) {
              ss.__ss_align._4_4_ = 0x80;
              iVar1 = getsockname(iVar1,(sockaddr *)&fd,(socklen_t *)((long)&ss.__ss_align + 4));
              if (((iVar1 == 0) && ((2 < ss.__ss_align._4_4_ && (ss.__ss_align._4_4_ < 0x6c)))) &&
                 (fd._2_1_ == '\0')) {
                ss.__ss_align._4_4_ = ss.__ss_align._4_4_ - 3;
                *(short *)((long)arg + 0x8a) = (short)ss.__ss_align._4_4_;
                memcpy((void *)((long)arg + 0x8c),(void *)((long)&fd + 3),(ulong)ss.__ss_align._4_4_
                      );
              }
            }
            *(undefined1 *)((long)arg + 0x128) = 1;
            *(char **)((long)arg + 0x130) = local_b8;
            nni_mtx_unlock((nni_mtx *)((long)arg + 0x140));
            arg_local._4_4_ = 0;
          }
          else {
            nni_mtx_unlock((nni_mtx *)((long)arg + 0x140));
            close(iVar1);
            if (local_b8 != (char *)0x0) {
              unlink(local_b8);
            }
            nni_strfree(local_b8);
            arg_local._4_4_ = path._4_4_;
          }
        }
      }
      else {
        nni_mtx_unlock((nni_mtx *)((long)arg + 0x140));
        arg_local._4_4_ = 7;
      }
    }
    else {
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x140));
      arg_local._4_4_ = 0xb;
    }
  }
  return arg_local._4_4_;
}

Assistant:

int
ipc_listener_listen(void *arg)
{
	ipc_listener           *l = arg;
	socklen_t               len;
	struct sockaddr_storage ss;
	int                     rv;
	int                     fd;
	char                   *path;

	if ((len = nni_posix_nn2sockaddr(&ss, &l->sa)) < sizeof(sa_family_t)) {
		return (NNG_EADDRINVAL);
	}

	nni_mtx_lock(&l->mtx);
	if (l->started) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ESTATE);
	}
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ECLOSED);
	}

	switch (l->sa.s_family) {
	case NNG_AF_IPC:
		if ((path = nni_strdup(l->sa.s_ipc.sa_path)) == NULL) {
			nni_mtx_unlock(&l->mtx);
			return (NNG_ENOMEM);
		}
		break;
	case NNG_AF_ABSTRACT:
		path = NULL;
		break;
	default:
		nni_mtx_unlock(&l->mtx);
		return (NNG_EADDRINVAL);
	}

	if ((fd = socket(AF_UNIX, SOCK_STREAM | SOCK_CLOEXEC, 0)) < 0) {
		rv = nni_plat_errno(errno);
		nni_mtx_unlock(&l->mtx);
		nni_strfree(path);
		return (rv);
	}

	if ((rv = bind(fd, (struct sockaddr *) &ss, len)) != 0) {
		if ((l->sa.s_family == NNG_AF_IPC) &&
		    ((errno == EEXIST) || (errno == EADDRINUSE))) {
			ipc_remove_stale(path);
			rv = bind(fd, (struct sockaddr *) &ss, len);
		}
		if (rv != 0) {
			nni_strfree(path);
			path = NULL;
		}
	}

	if ((rv != 0) || (ipc_listener_chmod(l, path) != 0) ||
	    (listen(fd, 128) != 0)) {
		rv = nni_plat_errno(errno);
	}
	if (rv != 0) {
		nni_mtx_unlock(&l->mtx);
		(void) close(fd);
		if (path != NULL) {
			unlink(path);
		}
		nni_strfree(path);
		return (rv);
	}

	nni_posix_pfd_init(&l->pfd, fd, ipc_listener_cb, l);

#ifdef NNG_HAVE_ABSTRACT_SOCKETS
	// If the original address was for a system assigned value,
	// then figure out what we got.  This is analogous to TCP
	// binding to port 0.
	if ((l->sa.s_family == NNG_AF_ABSTRACT) &&
	    (l->sa.s_abstract.sa_len == 0)) {
		struct sockaddr_un *su = (void *) &ss;
		len                    = sizeof(ss);
		if ((getsockname(fd, (struct sockaddr *) &ss, &len) == 0) &&
		    (len > sizeof(sa_family_t)) &&
		    (len <= sizeof(l->sa.s_abstract.sa_name)) &&
		    (su->sun_path[0] == '\0')) {
			len -= sizeof(sa_family_t);
			len--; // don't count the leading NUL.
			l->sa.s_abstract.sa_len = len;
			memcpy(
			    l->sa.s_abstract.sa_name, &su->sun_path[1], len);
		}
	}
#endif

	l->started = true;
	l->path    = path;
	nni_mtx_unlock(&l->mtx);

	return (0);
}